

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O1

void Bac_ManMarkNodesGia(Bac_Man_t *p,Gia_Man_t *pGia)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  uint *puVar12;
  uint uVar13;
  uint uVar14;
  
  iVar2 = (p->vBuf2LeafNtk).nSize;
  iVar3 = pGia->nBufs;
  if (iVar2 != iVar3) {
    __assert_fail("Vec_IntSize(&p->vBuf2LeafNtk) == Gia_ManBufNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                  ,0x118,"void Bac_ManMarkNodesGia(Bac_Man_t *, Gia_Man_t *)");
  }
  pGVar6 = pGia->pObjs;
  pGVar6->Value = 1;
  pVVar7 = pGia->vCis;
  uVar13 = pVVar7->nSize;
  iVar4 = pGia->nRegs;
  if (uVar13 - iVar4 != 0 && iVar4 <= (int)uVar13) {
    uVar11 = 0;
    uVar9 = (ulong)uVar13;
    if ((int)uVar13 < 1) {
      uVar9 = uVar11;
    }
    do {
      if (uVar9 == uVar11) goto LAB_008b1bed;
      iVar5 = pVVar7->pArray[uVar11];
      if (((long)iVar5 < 0) || (pGia->nObjs <= iVar5)) goto LAB_008b1bce;
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      pGVar6[iVar5].Value = 1;
      uVar11 = uVar11 + 1;
    } while (uVar13 - iVar4 != uVar11);
  }
  iVar5 = pGia->nObjs;
  lVar8 = (long)iVar5;
  if (0 < lVar8) {
    puVar12 = &pGVar6->Value;
    uVar9 = 0;
    while (pGVar6 != (Gia_Obj_t *)0x0) {
      uVar11 = *(ulong *)(puVar12 + -2);
      uVar13 = (uint)uVar11;
      if ((uVar11 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
        uVar14 = (uint)(uVar11 >> 0x20);
        if ((((int)uVar13 < 0) || ((uVar13 & 0x1fffffff) == 0x1fffffff)) ||
           ((uVar13 & 0x1fffffff) != (uVar14 & 0x1fffffff))) {
          uVar13 = *(uint *)((long)puVar12 + (ulong)(uint)((int)(uVar11 & 0x1fffffff) << 2) * -3);
          *puVar12 = uVar13;
          if (uVar13 != *(uint *)((long)puVar12 + (ulong)((uVar14 & 0x1fffffff) << 2) * -3)) {
            __assert_fail("pObj->Value == Gia_ObjFanin1(pObj)->Value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                          ,0x123,"void Bac_ManMarkNodesGia(Bac_Man_t *, Gia_Man_t *)");
          }
        }
        else {
          iVar10 = (int)uVar9;
          if ((iVar10 < 0) || (iVar2 <= iVar10)) goto LAB_008b1bed;
          *puVar12 = (p->vBuf2LeafNtk).pArray[uVar9];
          uVar9 = (ulong)(iVar10 + 1);
        }
      }
      iVar10 = (int)uVar9;
      puVar12 = puVar12 + 3;
      lVar8 = lVar8 + -1;
      if (lVar8 == 0) goto LAB_008b1b4e;
    }
  }
  iVar10 = 0;
LAB_008b1b4e:
  if (iVar10 != iVar3) {
    __assert_fail("Count == Gia_ManBufNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                  ,0x126,"void Bac_ManMarkNodesGia(Bac_Man_t *, Gia_Man_t *)");
  }
  pVVar7 = pGia->vCos;
  uVar13 = pVVar7->nSize;
  if (uVar13 - iVar4 != 0 && iVar4 <= (int)uVar13) {
    uVar11 = 0;
    uVar9 = (ulong)uVar13;
    if ((int)uVar13 < 1) {
      uVar9 = uVar11;
    }
    do {
      if (uVar9 == uVar11) {
LAB_008b1bed:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = pVVar7->pArray[uVar11];
      if (((long)iVar2 < 0) || (iVar5 <= iVar2)) {
LAB_008b1bce:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar6 == (Gia_Obj_t *)0x0) {
        return;
      }
      pGVar1 = pGVar6 + iVar2;
      if (pGVar1[-(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)].Value != 1) {
        __assert_fail("Gia_ObjFanin0(pObj)->Value == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                      ,0x129,"void Bac_ManMarkNodesGia(Bac_Man_t *, Gia_Man_t *)");
      }
      pGVar1->Value = 1;
      uVar11 = uVar11 + 1;
    } while (uVar13 - iVar4 != uVar11);
  }
  return;
}

Assistant:

void Bac_ManMarkNodesGia( Bac_Man_t * p, Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj; int i, Count = 0;
    assert( Vec_IntSize(&p->vBuf2LeafNtk) == Gia_ManBufNum(pGia) );
    Gia_ManConst0(pGia)->Value = 1;
    Gia_ManForEachPi( pGia, pObj, i )
        pObj->Value = 1;
    Gia_ManForEachAnd( pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Vec_IntEntry( &p->vBuf2LeafNtk, Count++ );
        else
        {
            pObj->Value = Gia_ObjFanin0(pObj)->Value;
            assert( pObj->Value == Gia_ObjFanin1(pObj)->Value );
        }
    }
    assert( Count == Gia_ManBufNum(pGia) );
    Gia_ManForEachPo( pGia, pObj, i )
    {
        assert( Gia_ObjFanin0(pObj)->Value == 1 );
        pObj->Value = 1;
    }
}